

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_Mesh::Read(ON_Mesh *this,ON_BinaryArchive *file)

{
  int iVar1;
  ON_2fPoint *pOVar2;
  double dVar3;
  double dVar4;
  ON_Mesh *pOVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  endian eVar9;
  uint uVar10;
  ON_MeshParameters *this_00;
  ON_MeshCurvatureStats *this_01;
  ON_3dPoint *pOVar11;
  ON_Mesh *this_02;
  int iVar12;
  ON__INT32 *pOVar13;
  undefined1 *puVar14;
  ON_2dPoint *pOVar15;
  ON__UINT8 *pOVar16;
  uint *puVar17;
  ON_BinaryArchive *pOVar18;
  long lVar19;
  long lVar20;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 uVar22;
  ON_3fVector OVar23;
  uchar b;
  int minor_version;
  int vcount;
  bool bHasNgons;
  ON__UINT32 tcode;
  int major_version;
  bool bHasDoublePrecisionVertices;
  int b_packed_tex_rotate;
  int fcount;
  ON__INT64 big_value;
  bool bFailedCRC;
  float fbbox [2] [3];
  ON__UINT8 local_e1;
  ON__INT32 local_e0;
  int local_dc;
  ON__INT32 local_d8;
  bool local_d1;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  bool local_c1;
  ON_2dPoint local_c0;
  ON_Mesh *local_b0;
  ON__INT32 local_a4;
  ON__INT64 local_a0;
  ON_3fVector local_98;
  float local_88 [6];
  ON_SimpleArray<ON_3dPoint> *local_70;
  undefined1 local_68 [16];
  long local_50;
  undefined4 local_48;
  uint uStack_44;
  uint uStack_3c;
  
  Destroy(this);
  local_c8 = 0;
  local_dc = 0;
  bVar6 = ON_BinaryArchive::Read3dmChunkVersion(file,(int *)&local_c8,&local_dc);
  if (!bVar6) {
    return bVar6;
  }
  if ((local_c8 & 0xfffffffd) != 1) {
    return bVar6;
  }
  pOVar13 = &local_d8;
  local_d8 = 0;
  local_a4 = 0;
  bVar6 = ON_BinaryArchive::ReadInt(file,pOVar13);
  iVar12 = (int)pOVar13;
  if (bVar6) {
    pOVar13 = &local_a4;
    bVar6 = ON_BinaryArchive::ReadInt(file,pOVar13);
    iVar12 = (int)pOVar13;
  }
  if (bVar6 != false) {
    puVar14 = &this->field_0x270;
    bVar6 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)puVar14);
    iVar12 = (int)puVar14;
  }
  if (bVar6 != false) {
    puVar14 = &this->field_0x280;
    bVar6 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)puVar14);
    iVar12 = (int)puVar14;
  }
  if (bVar6 != false) {
    puVar14 = &this->field_0x240;
    bVar6 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)puVar14);
    iVar12 = (int)puVar14;
  }
  if (bVar6 != false) {
    puVar14 = &this->field_0x250;
    bVar6 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)puVar14);
    iVar12 = (int)puVar14;
  }
  if (bVar6 != false) {
    iVar12 = 2;
    bVar6 = ON_BinaryArchive::ReadDouble(file,2,this->m_srf_scale);
  }
  local_88[0] = 1.0;
  local_88[1] = 1.0;
  local_88[2] = 1.0;
  local_88[3] = -1.0;
  local_88[4] = -1.0;
  local_88[5] = -1.0;
  if (bVar6 != false) {
    iVar12 = 6;
    bVar6 = ON_BinaryArchive::ReadFloat(file,6,local_88);
  }
  if (bVar6 != false) {
    if (local_88[0] <= local_88[3]) {
      if (local_88[1] <= local_88[4]) {
        if (local_88[2] <= local_88[5]) {
          ON_3fPoint::ON_3fPoint((ON_3fPoint *)&local_c0,local_88);
          ON_3dPoint::operator=(&(this->m_vertex_bbox).m_min,(ON_3fPoint *)&local_c0);
          pOVar15 = &local_c0;
          ON_3fPoint::ON_3fPoint((ON_3fPoint *)pOVar15,local_88 + 3);
          ON_3dPoint::operator=(&(this->m_vertex_bbox).m_max,(ON_3fPoint *)pOVar15);
          iVar12 = (int)pOVar15;
        }
      }
    }
    if (bVar6 != false) {
      iVar12 = 6;
      bVar6 = ON_BinaryArchive::ReadFloat(file,6,this->m_nbox[0]);
    }
  }
  if (bVar6 != false) {
    iVar12 = 4;
    bVar6 = ON_BinaryArchive::ReadFloat(file,4,this->m_tbox[0]);
  }
  local_e0 = -1;
  if (bVar6 != false) {
    pOVar13 = &local_e0;
    bVar6 = ON_BinaryArchive::ReadInt(file,pOVar13);
    iVar12 = (int)pOVar13;
  }
  if (bVar6 == false) {
    local_e1 = '\0';
    local_d0 = 0;
    local_a0 = 0;
  }
  else {
    if ((local_e0 == 2) || (local_e0 == 1)) {
      if (this->m_mesh_is_closed != '\x01') {
        this->m_mesh_is_closed = '\x01';
        goto LAB_005033fa;
      }
    }
    else if ((local_e0 == 0) && (this->m_mesh_is_solid = '\x03', this->m_mesh_is_closed != '\x02'))
    {
      this->m_mesh_is_closed = '\x02';
LAB_005033fa:
      this->m_mesh_is_manifold = '\0';
      this->m_mesh_is_oriented = '\0';
    }
    local_e1 = '\0';
    local_d0 = 0;
    local_a0 = 0;
    if (bVar6 != false) {
      pOVar16 = &local_e1;
      bVar6 = ON_BinaryArchive::ReadChar(file,pOVar16);
      iVar12 = (int)pOVar16;
    }
  }
  if ((bVar6 != false) && (local_e1 != '\0')) {
    puVar17 = &local_d0;
    bVar6 = ON_BinaryArchive::BeginRead3dmBigChunk(file,puVar17,&local_a0);
    iVar12 = (int)puVar17;
    if (bVar6) {
      bVar7 = false;
      if (local_d0 == 0x40008000) {
        this_00 = (ON_MeshParameters *)operator_new(0xe0);
        memset(this_00,0,0xe0);
        ON_MeshParameters::ON_MeshParameters(this_00);
        this->m_mesh_parameters = this_00;
        pOVar18 = file;
        bVar7 = ON_MeshParameters::Read(this_00,file);
        iVar12 = (int)pOVar18;
      }
      bVar8 = ON_BinaryArchive::EndRead3dmChunk(file);
      bVar6 = false;
      if (bVar8) {
        bVar6 = bVar7;
      }
    }
  }
  local_e0 = 0;
  iVar1 = local_e0;
  local_b0 = this;
  if (bVar6 != false) {
    do {
      pOVar16 = &local_e1;
      bVar6 = ON_BinaryArchive::ReadChar(file,&local_e1);
      iVar12 = (int)pOVar16;
      if ((bVar6) && (local_e1 != '\0')) {
        local_d0 = 0;
        local_a0 = 0;
        puVar17 = &local_d0;
        bVar6 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_d0,&local_a0);
        iVar12 = (int)puVar17;
        if (bVar6) {
          if (local_d0 == 0x40008000) {
            this_01 = (ON_MeshCurvatureStats *)operator_new(0x40);
            ON_MeshCurvatureStats::ON_MeshCurvatureStats(this_01);
            local_b0->m_kstat[local_e0] = this_01;
            pOVar18 = file;
            bVar6 = ON_MeshCurvatureStats::Read(this_01,file);
            iVar12 = (int)pOVar18;
          }
          else {
            bVar6 = false;
          }
          bVar7 = ON_BinaryArchive::EndRead3dmChunk(file);
          if (!bVar7) {
            bVar6 = false;
          }
        }
      }
      iVar1 = local_e0 + 1;
    } while ((bVar6 != false) && (bVar7 = local_e0 < 3, local_e0 = iVar1, bVar7));
  }
  local_e0 = iVar1;
  this_02 = local_b0;
  if (bVar6 != false) {
    bVar6 = ReadFaceArray(local_b0,iVar12,local_a4,file);
  }
  if (bVar6 != false) {
    if (local_c8 == 3) {
      bVar6 = Read_2(this_02,local_d8,file);
    }
    else if (local_c8 == 1) {
      bVar6 = Read_1(this_02,file);
    }
    else {
      bVar6 = false;
    }
  }
  if (1 < local_dc) {
    local_c0.x = (double)CONCAT44(local_c0.x._4_4_,(uint)this_02->m_packed_tex_rotate);
    if (bVar6 != false) {
      bVar6 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_c0);
    }
    this_02->m_packed_tex_rotate = local_c0.x._0_4_ != 0;
  }
  if ((local_c8 != 3) || (local_dc < 3)) goto LAB_00503a1c;
  if (bVar6 != false) {
    bVar6 = ON_BinaryArchive::ReadUuid(file,&(this_02->m_Ttag).m_mapping_id);
  }
  if ((bVar6 != false) && (0 < local_d8)) {
    local_c0.x = 0.0;
    local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
    bVar6 = ON_BinaryArchive::ReadCompressedBufferSize(file,(size_t *)&local_c0);
    if (local_c0.x != 0.0 && bVar6) {
      if (local_c0.x == (double)((long)local_d8 << 4)) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&(this_02->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)local_d8);
        bVar6 = ON_BinaryArchive::ReadCompressedBuffer
                          (file,(size_t)local_c0.x,
                           (this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a,(bool *)&local_98);
        if (((bVar6) && (-1 < local_d8)) &&
           (local_d8 <= (this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity)) {
          (this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = local_d8;
        }
        eVar9 = ON_BinaryArchive::Endian(file);
        if (eVar9 == big_endian) {
          pOVar15 = (this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
          ON_BinaryArchive::ToggleByteOrder
                    ((long)(this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count * 2,8,pOVar15,
                     pOVar15);
        }
      }
      else {
        bVar6 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0xa6a,"","ON_Mesh::Read - surface parameter buffer size is wrong.");
        uVar10 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
        if (uVar10 < 0xbfb2f6a) {
          if ((ulong)local_c0.x < 0x10 || ((ulong)local_c0.x & 0xf) != 0) {
            bVar6 = false;
          }
          else {
            ON_SimpleArray<ON_2dPoint>::SetCapacity
                      (&(this_02->m_S).super_ON_SimpleArray<ON_2dPoint>,
                       (long)(int)((ulong)local_c0.x >> 4));
            bVar6 = ON_BinaryArchive::ReadCompressedBuffer
                              (file,(size_t)local_c0.x,
                               (this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a,(bool *)&local_98
                              );
            ON_SimpleArray<ON_2dPoint>::SetCapacity
                      (&(this_02->m_S).super_ON_SimpleArray<ON_2dPoint>,0);
          }
        }
      }
    }
  }
  if ((local_dc < 4) ||
     (uVar10 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), uVar10 < 0xbf5013a))
  goto LAB_00503a1c;
  if (bVar6 != false) {
    bVar6 = ON_MappingTag::Read(&this_02->m_Ttag,file);
  }
  if (local_dc < 5) goto LAB_00503a1c;
  if (bVar6 != false) {
    bVar6 = ON_BinaryArchive::ReadChar(file,&this_02->m_mesh_is_manifold);
  }
  if (bVar6 != false) {
    bVar6 = ON_BinaryArchive::ReadChar(file,&this_02->m_mesh_is_oriented);
  }
  if (bVar6 != false) {
    bVar6 = ON_BinaryArchive::ReadChar(file,&this_02->m_mesh_is_solid);
  }
  if ((bVar6 == false) || (local_dc < 6)) goto LAB_00503a1c;
  local_d1 = false;
  bVar6 = ON_BinaryArchive::ReadBool(file,&local_d1);
  if ((bVar6) && (local_d1 == true)) {
    bVar6 = ReadMeshNgons(file,&this_02->m_NgonAllocator,&this_02->m_Ngon);
  }
  if ((bVar6 == false) || (local_dc < 7)) goto LAB_00503a1c;
  local_c1 = false;
  bVar6 = ON_BinaryArchive::ReadBool(file,&local_c1);
  if (local_c1 == true) {
    local_70 = &(this_02->m_dV).super_ON_SimpleArray<ON_3dPoint>;
    bVar6 = ReadMeshDoublePrecisionVertices(file,local_70);
    pOVar5 = local_b0;
    if (bVar6) {
      uVar10 = (this_02->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
      if (uVar10 == 0 || uVar10 != (this_02->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)
      goto LAB_005039a2;
      local_50 = (ulong)uVar10 * 0xc + -0xc;
      lVar19 = 0;
      local_cc = 0;
      lVar20 = 0;
      do {
        ON_3fPoint::ON_3fPoint
                  ((ON_3fPoint *)&local_c0,
                   (ON_3dPoint *)
                   ((long)&((pOVar5->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar19));
        dVar3 = ON_3fPoint::MaximumCoordinate
                          ((ON_3fPoint *)
                           ((long)&((pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a)->x + lVar20)
                          );
        local_68._0_8_ = (ulong)dVar3 & 0x7fffffffffffffff;
        local_68._8_4_ = extraout_XMM0_Dc;
        local_68._12_4_ = extraout_XMM0_Dd & 0x7fffffff;
        OVar23 = ON_3fPoint::operator-
                           ((ON_3fPoint *)&local_c0,
                            (ON_3fPoint *)
                            ((long)&((pOVar5->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a)->x + lVar20
                            ));
        local_98.z = OVar23.z;
        local_98._0_8_ = OVar23._0_8_;
        dVar3 = ON_3fVector::MaximumCoordinate(&local_98);
        uVar22 = local_68._12_4_;
        uVar10 = (uint)((ulong)dVar3 >> 0x20) & 0x7fffffff;
        dVar4 = local_68._0_8_ * 1e-06;
        uVar21 = SUB84(dVar3,0);
        if (dVar4 < ABS(dVar3)) {
          local_68._8_4_ = local_68._8_4_;
          local_68._0_8_ = dVar4;
          local_68._12_4_ = uVar22;
          local_48 = SUB84(dVar3,0);
          uStack_44 = uVar10;
          uStack_3c = extraout_XMM0_Dd_00 & 0x7fffffff;
          pOVar11 = ON_SimpleArray<ON_3dPoint>::SetCapacity(local_70,0);
          local_cc = (uint)CONCAT71((int7)((ulong)pOVar11 >> 8),1);
          uVar21 = local_48;
          uVar10 = uStack_44;
          dVar4 = (double)local_68._0_8_;
        }
        if (dVar4 < (double)CONCAT44(uVar10,uVar21)) break;
        lVar19 = lVar19 + 0x18;
        bVar7 = local_50 != lVar20;
        lVar20 = lVar20 + 0xc;
      } while (bVar7);
    }
    else {
LAB_005039a2:
      local_cc = 0;
    }
    this_02 = local_b0;
    uVar10 = local_cc;
    if (((bVar6) &&
        ((local_b0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count ==
         (local_b0->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) && (local_dc < 8)) {
      ON_BoundingBox::Set(&local_b0->m_vertex_bbox,local_70,0);
    }
  }
  else {
    uVar10 = 0;
  }
  if ((bVar6 != false) && (7 < local_dc)) {
    bVar6 = ON_BinaryArchive::ReadBoundingBox(file,&this_02->m_vertex_bbox);
  }
  if ((uVar10 & 1) != 0) {
    ON_BoundingBox::Set(&this_02->m_vertex_bbox,&(this_02->m_V).super_ON_SimpleArray<ON_3fPoint>,0);
  }
LAB_00503a1c:
  if (((((this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == 0) &&
       (0 < (this_02->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) &&
      ((iVar12 = (this_02->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar12 &&
       (((((this_02->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar12 &&
          (bVar7 = ON_Interval::IsIncreasing((ON_Interval *)&this_02->field_0x240), bVar7)) &&
         (bVar7 = ON_Interval::IsIncreasing((ON_Interval *)&this_02->field_0x250), bVar7)) &&
        ((bVar7 = ON_Interval::IsInterval((ON_Interval *)&this_02->field_0x270), bVar7 &&
         (bVar7 = ON_Interval::IsInterval((ON_Interval *)&this_02->field_0x280), bVar7)))))))) &&
     ((this_02->m_Ttag).m_mapping_crc == 0)) {
    bVar7 = ON_UuidIsNil(&(this_02->m_Ttag).m_mapping_id);
    if (bVar7) {
      ON_SimpleArray<ON_2dPoint>::SetCapacity
                (&(this_02->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)local_d8);
      if (-1 < (this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
        (this_02->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
      }
      local_e0 = 0;
      if (0 < local_d8) {
        do {
          pOVar2 = (this_02->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
          local_c0.x = (double)pOVar2[local_e0].x;
          local_c0.y = (double)pOVar2[local_e0].y;
          GetSurfaceParametersHelper(this_02,local_c0.x,local_c0.y,&local_c0.x,&local_c0.y);
          ON_SimpleArray<ON_2dPoint>::Append
                    (&(this_02->m_S).super_ON_SimpleArray<ON_2dPoint>,&local_c0);
          local_e0 = local_e0 + 1;
        } while (local_e0 < local_d8);
      }
      ON_MappingTag::Set(&this_02->m_Ttag,&ON_TextureMapping::SurfaceParameterTextureMapping);
    }
  }
  return bVar6;
}

Assistant:

bool ON_Mesh::Read( ON_BinaryArchive& file )
{
  Destroy();

  int major_version = 0;
  int minor_version = 0;
  int i;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  
  if (rc && (1 == major_version || 3 == major_version) ) 
  {
    int vcount = 0;
    int fcount = 0;

    if (rc) rc = file.ReadInt( &vcount );
    if (rc) rc = file.ReadInt( &fcount );
    if (rc) rc = file.ReadInterval( m_packed_tex_domain[0] );
    if (rc) rc = file.ReadInterval( m_packed_tex_domain[1] );
    if (rc) rc = file.ReadInterval( m_srf_domain[0] );
    if (rc) rc = file.ReadInterval( m_srf_domain[1] );
    if (rc) rc = file.ReadDouble( 2, m_srf_scale );

    float fbbox[2][3] = { { 1.0f, 1.0f, 1.0f }, { -1.0f, -1.0f, -1.0f } };
    if (rc) rc = file.ReadFloat( 6, &fbbox[0][0] );
    if (rc && fbbox[0][0] <= fbbox[1][0] && fbbox[0][1] <= fbbox[1][1] && fbbox[0][2] <= fbbox[1][2] )
    {
      // When minor_version >= 8, m_vertex_bbox will be read from the archive later.
      m_vertex_bbox.m_min = ON_3fPoint(fbbox[0]);
      m_vertex_bbox.m_max = ON_3fPoint(fbbox[1]);
    }

    if (rc) rc = file.ReadFloat( 6, &m_nbox[0][0] );
    if (rc) rc = file.ReadFloat( 4, &m_tbox[0][0] );

    // int value meaning: -1 = unknown 0 = mesh is not closed, 1 = mesh is closed
    i = -1;
    if (rc) rc = file.ReadInt( &i );
    if (rc)
    {
      switch(i)
      {
      case 0: // not closed;
        SetClosed(0);
        break;
      case 1: // closed;
        SetClosed(1);
        break;
      case 2: // 13 April 2010 Dale Lear - "2" value is obsolete but appears in old files
        SetClosed(1);
        break;
      }
    }

    unsigned char b = 0;
    ON__UINT32 tcode=0;
    ON__INT64 big_value=0;
    if (rc) rc = file.ReadChar(&b);
    if (rc && b) 
    {
      // mesh parameters are in an anonymous chunk
      rc = file.BeginRead3dmBigChunk(&tcode,&big_value);
      if (rc) 
      {
        if ( TCODE_ANONYMOUS_CHUNK == tcode )
        {
          m_mesh_parameters = new ON_MeshParameters();
          rc = m_mesh_parameters->Read( file );
        }
        else
          rc = false;
        if (!file.EndRead3dmChunk())
          rc = false;
      }
    }

    for ( i = 0; rc && i < 4; i++ ) 
    {
      rc = file.ReadChar(&b);
      if (rc && b) 
      {
        // m_kstat[i] curvature stats are in an anonymous chunk
        tcode = 0;
        big_value = 0;
        rc = file.BeginRead3dmBigChunk( &tcode, &big_value );
        if (rc) 
        {
          if ( TCODE_ANONYMOUS_CHUNK == tcode )
          {
            m_kstat[i] = new ON_MeshCurvatureStats();
            rc = m_kstat[i]->Read(file);
          }
          else
            rc = false;
          if ( !file.EndRead3dmChunk() )
            rc = false;
        }
      }
    }

    if (rc) rc = ReadFaceArray( vcount, fcount, file );

    if (rc) {
      if ( major_version==1) {
        rc = Read_1(file);
      }
      else if ( major_version == 3 ) {
        rc = Read_2(vcount,file);
      }
      else
        rc = false;
    }

    if ( minor_version >= 2 ) 
    {
      int b_packed_tex_rotate = m_packed_tex_rotate;
      if (rc) rc = file.ReadInt( &b_packed_tex_rotate );
      m_packed_tex_rotate = b_packed_tex_rotate?true:false;
    }

    if ( 3 == major_version )
    {
      if ( minor_version >= 3 )
      {
        // added for minor version 3.3
        if (rc) rc = file.ReadUuid( m_Ttag.m_mapping_id );

        // compressed m_S[]
        if ( rc && vcount > 0 ) 
        {
          size_t sz = 0;
          bool bFailedCRC=false;
          if (rc) rc = file.ReadCompressedBufferSize( &sz );
          if (rc && sz) 
          {
            if ( sz == vcount*sizeof(ON_2dPoint) )
            {
              m_S.SetCapacity(vcount);
              if (rc) rc = file.ReadCompressedBuffer( sz, m_S.Array(), &bFailedCRC );
              if (rc) m_S.SetCount(vcount);
              if (ON::endian::big_endian == file.Endian())
              {
                file.ToggleByteOrder( m_S.Count()*2, 8, m_S.Array(), (void*)m_S.Array() );
              }
            }
            else
            {
              ON_ERROR("ON_Mesh::Read - surface parameter buffer size is wrong.");
              if (    rc
                   && file.ArchiveOpenNURBSVersion() <= 201011049 
                   && 0 == (sz % sizeof(ON_2dPoint))
                   && sz >= sizeof(ON_2dPoint)
                 )
              {
                // Before 201011049 there was a bug that let m_S[] arrays with
                // the wrong size get saved in files. There was also a bug in 
                // the Rhino .OBJ file reader that created meshes with m_S[] 
                // arrays that had the wrong size.  The next 4 lines of code
                // let us read the junk, discard it and then successfully read
                // the rest of the file.
                int Scount = (int)(sz / sizeof(ON_2dPoint));
                m_S.SetCapacity(Scount);
                rc = file.ReadCompressedBuffer( sz, m_S.Array(), &bFailedCRC );
                m_S.Destroy();
              }
              else
              {
                rc = false; // buffer is wrong size
              }
            }
          }
        }
        if ( minor_version >= 4 && file.ArchiveOpenNURBSVersion() >= 200606010 )
        {
          if (rc) rc = m_Ttag.Read(file);
          if ( minor_version >= 5 )
          {
            if (rc) rc = file.ReadChar( &m_mesh_is_manifold );
            if (rc) rc = file.ReadChar( &m_mesh_is_oriented );
            if (rc) rc = file.ReadChar( &m_mesh_is_solid );

            if ( rc && minor_version >= 6 )
            {
              // added n-gons version 3.6
              bool bHasNgons = false;    
              rc =  file.ReadBool(&bHasNgons);
              if (rc && bHasNgons)
                rc = ReadMeshNgons(file, m_NgonAllocator, m_Ngon);
              if (rc && minor_version >= 7)
              {
                bool bHasDoublePrecisionVertices = false;
                rc = file.ReadBool(&bHasDoublePrecisionVertices);
                bool bHasInvalidDoublePrecisionVertices = false;
                if (bHasDoublePrecisionVertices)
                {
                  // Added explicit double precision vertices chunk version 3.7
                  // (used to be on user data)
                  rc = ReadMeshDoublePrecisionVertices(file, m_dV);
                  if (rc && m_dV.UnsignedCount() == m_V.UnsignedCount())
                  {
                    // Validate m_dV[] - some files contain different values for m_V[] and m_dV[].
                    // When this happens, delete m_dV[].
                    const unsigned int dvcount = m_dV.UnsignedCount();
                    for (unsigned int vdex = 0; vdex < dvcount; vdex++)
                    {
                      const ON_3fPoint P(m_dV[vdex]);
                      const double m = fabs(m_V[vdex].MaximumCoordinate());
                      const double d = fabs((P - m_V[vdex]).MaximumCoordinate());
                      if (d <= m*1.0e-6)
                        continue;
                      bHasInvalidDoublePrecisionVertices = true;
                      m_dV.Destroy();
                      break;
                    }
                  }
                  if (rc && m_dV.UnsignedCount() == m_V.UnsignedCount() && minor_version <= 7)
                  {
                    m_vertex_bbox.Set(m_dV, false);
                  }
                }
                if (rc && minor_version >= 8)
                {
                  rc = file.ReadBoundingBox(m_vertex_bbox);
                }
                if (bHasInvalidDoublePrecisionVertices)
                {
                  m_vertex_bbox.Set(m_V, false);
                }
              }
            }
          }
        }
      }
    }

    if (    0 == m_S.Count()
         && m_V.Count() > 0
         && HasTextureCoordinates()
         && m_srf_domain[0].IsIncreasing() 
         && m_srf_domain[1].IsIncreasing() 
         && m_packed_tex_domain[0].IsInterval()
         && m_packed_tex_domain[1].IsInterval()
         && 0 == m_Ttag.m_mapping_crc
         && ON_UuidIsNil(m_Ttag.m_mapping_id)
          ) 
    {
      // This is a mesh from an old file - but there is enough 
      // information to calculate the m_S[] values from the 
      // m_T[] values.
      m_S.SetCapacity(vcount);
      m_S.SetCount(0);
      ON_2dPoint sp;
      ON_2fPoint tc;
      for ( i = 0; i < vcount; i++)
      {
        tc = m_T[i];
        sp.x = tc.x;
        sp.y = tc.y;
        GetSurfaceParametersHelper(*this,sp.x,sp.y,&sp.x,&sp.y);
        m_S.Append(sp);
      }
      m_Ttag.SetDefaultSurfaceParameterMappingTag();
    }
  }

  return rc;
}